

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_object_defineProperty(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int magic)

{
  JSAtom prop;
  int iVar1;
  ulong uVar2;
  JSRefCountHeader *p;
  JSValueUnion JVar3;
  JSValue obj;
  JSValue JVar4;
  int64_t iStackY_50;
  
  iStackY_50 = argv->tag;
  if ((int)iStackY_50 == -1) {
    JVar3 = (JSValueUnion)(argv->u).ptr;
    JVar4 = argv[2];
    prop = JS_ValueToAtom(ctx,argv[1]);
    if (prop != 0) {
      obj.tag = iStackY_50;
      obj.u.ptr = JVar3.ptr;
      iVar1 = JS_DefinePropertyDesc(ctx,obj,prop,JVar4,(uint)(magic == 0) << 0xe);
      JS_FreeAtom(ctx,prop);
      if (-1 < iVar1) {
        if (magic == 0) {
          *(int *)JVar3.ptr = *JVar3.ptr + 1;
          uVar2 = (ulong)JVar3.ptr & 0xffffffff00000000;
          goto LAB_0010e72b;
        }
        JVar3._1_7_ = 0;
        JVar3.int32._0_1_ = iVar1 != 0;
        iStackY_50 = 1;
        goto LAB_0010e729;
      }
    }
    JVar3.float64 = 0.0;
    iStackY_50 = 6;
  }
  else {
    JVar3.float64 = 0.0;
    JS_ThrowTypeError(ctx,"not an object",this_val.tag);
    iStackY_50 = 6;
  }
LAB_0010e729:
  uVar2 = 0;
LAB_0010e72b:
  JVar4.u.ptr = (void *)((ulong)JVar3.ptr & 0xffffffff | uVar2);
  JVar4.tag = iStackY_50;
  return JVar4;
}

Assistant:

static JSValue js_object_defineProperty(JSContext *ctx, JSValueConst this_val,
                                        int argc, JSValueConst *argv, int magic)
{
    JSValueConst obj, prop, desc;
    int ret, flags;
    JSAtom atom;

    obj = argv[0];
    prop = argv[1];
    desc = argv[2];

    if (JS_VALUE_GET_TAG(obj) != JS_TAG_OBJECT)
        return JS_ThrowTypeErrorNotAnObject(ctx);
    atom = JS_ValueToAtom(ctx, prop);
    if (unlikely(atom == JS_ATOM_NULL))
        return JS_EXCEPTION;
    flags = 0;
    if (!magic)
        flags |= JS_PROP_THROW;
    ret = JS_DefinePropertyDesc(ctx, obj, atom, desc, flags);
    JS_FreeAtom(ctx, atom);
    if (ret < 0) {
        return JS_EXCEPTION;
    } else if (magic) {
        return JS_NewBool(ctx, ret);
    } else {
        return JS_DupValue(ctx, obj);
    }
}